

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  uint val;
  int iVar3;
  int iVar4;
  byte *str;
  byte *pbVar5;
  xmlChar *pxVar6;
  uint uVar7;
  uint uVar8;
  int l;
  int local_54;
  byte *local_50;
  uint local_48;
  int local_44;
  xmlParserInputPtr local_40;
  xmlChar **local_38;
  
  local_44 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    local_44 = 10000000;
  }
  local_50 = (byte *)0x0;
  bVar1 = *ctxt->input->cur;
  uVar7 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    uVar7 = 0x27;
  }
  str = (byte *)(*xmlMallocAtomic)(100);
  if (str == (byte *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_ENTITY_VALUE;
  local_40 = ctxt->input;
  if (((ctxt->progressive == 0) && ((long)local_40->end - (long)local_40->cur < 0xfa)) &&
     (xmlGROW(ctxt), ctxt->instate == XML_PARSER_EOF)) {
    pxVar6 = (xmlChar *)0x0;
    goto LAB_00156690;
  }
  local_38 = orig;
  xmlNextChar(ctxt);
  val = xmlCurrentChar(ctxt,&l);
  iVar4 = 0;
  local_48 = uVar7;
  iVar3 = 100;
  do {
    uVar8 = val;
    if ((int)val < 0x100) {
      if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
      goto LAB_00156435;
LAB_0015659f:
      str[iVar4] = 0;
      if (ctxt->instate == XML_PARSER_EOF) {
        pxVar6 = (xmlChar *)0x0;
        goto LAB_00156690;
      }
      if (uVar8 == uVar7) {
        xmlNextChar(ctxt);
        local_50 = str;
        goto LAB_001565d7;
      }
      pxVar6 = (xmlChar *)0x0;
      xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_FINISHED,(char *)0x0);
      goto LAB_00156690;
    }
    if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val)) goto LAB_0015659f;
LAB_00156435:
    if (((val == uVar7) && (uVar8 = uVar7, ctxt->input == local_40)) ||
       (uVar8 = val, ctxt->instate == XML_PARSER_EOF)) goto LAB_0015659f;
    pbVar5 = str;
    local_54 = iVar3;
    if (iVar3 <= iVar4 + 5) {
      local_54 = iVar3 * 2;
      pbVar5 = (byte *)(*xmlRealloc)(str,(long)local_54);
      if (pbVar5 == (byte *)0x0) {
        pxVar6 = (xmlChar *)0x0;
        xmlErrMemory(ctxt,(char *)0x0);
        goto LAB_0015668b;
      }
    }
    if (l == 1) {
      pbVar5[iVar4] = (byte)val;
      iVar4 = iVar4 + 1;
    }
    else {
      iVar3 = xmlCopyCharMultiByte(pbVar5 + iVar4,val);
      iVar4 = iVar3 + iVar4;
    }
    uVar7 = local_48;
    pxVar2 = ctxt->input;
    if (*pxVar2->cur == '\n') {
      pxVar2->line = pxVar2->line + 1;
      pxVar2->col = 1;
    }
    else {
      pxVar2->col = pxVar2->col + 1;
    }
    pxVar6 = pxVar2->cur + l;
    pxVar2->cur = pxVar6;
    if ((ctxt->progressive == 0) && ((long)pxVar2->end - (long)pxVar6 < 0xfa)) {
      xmlGROW(ctxt);
    }
    val = xmlCurrentChar(ctxt,&l);
    if (val == 0) {
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      val = xmlCurrentChar(ctxt,&l);
    }
    str = pbVar5;
    iVar3 = local_54;
  } while (iVar4 <= local_44);
  xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_NOT_FINISHED,"entity value too long\n");
  pxVar6 = (xmlChar *)0x0;
LAB_0015668b:
  if (str == (byte *)0x0) {
    return pxVar6;
  }
LAB_00156690:
  (*xmlFree)(str);
  return pxVar6;
LAB_001565d7:
  bVar1 = *local_50;
  uVar7 = (uint)bVar1;
  if (bVar1 == 0x25) {
LAB_001565f8:
    local_50 = local_50 + 1;
    pxVar6 = xmlParseStringName(ctxt,&local_50);
    if ((pxVar6 == (xmlChar *)0x0) || ((*xmlFree)(pxVar6), *local_50 != 0x3b)) {
      xmlFatalErrMsgInt(ctxt,XML_ERR_ENTITY_CHAR_ERROR,
                        "EntityValue: \'%c\' forbidden except for entities references\n",uVar7);
    }
    else {
      if (((uVar7 != 0x25) || (ctxt->inSubset != 1)) || (ctxt->inputNr != 1)) goto LAB_00156640;
      xmlFatalErr(ctxt,XML_ERR_ENTITY_PE_INTERNAL,(char *)0x0);
    }
    pxVar6 = (xmlChar *)0x0;
    goto LAB_0015668b;
  }
  if (bVar1 == 0x26) {
    if (local_50[1] != 0x23) goto LAB_001565f8;
  }
  else if (uVar7 == 0) goto LAB_001566b3;
LAB_00156640:
  local_50 = local_50 + 1;
  goto LAB_001565d7;
LAB_001566b3:
  ctxt->depth = ctxt->depth + 1;
  pxVar6 = xmlStringDecodeEntities(ctxt,str,2,'\0','\0','\0');
  ctxt->depth = ctxt->depth + -1;
  if (local_38 != (xmlChar **)0x0) {
    *local_38 = str;
    return pxVar6;
  }
  goto LAB_0015668b;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int c, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;
    xmlChar stop;
    xmlChar *ret = NULL;
    const xmlChar *cur = NULL;
    xmlParserInputPtr input;

    if (RAW == '"') stop = '"';
    else if (RAW == '\'') stop = '\'';
    else {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }

    /*
     * The content of the entity definition is copied in a buffer.
     */

    ctxt->instate = XML_PARSER_ENTITY_VALUE;
    input = ctxt->input;
    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    NEXT;
    c = CUR_CHAR(l);
    /*
     * NOTE: 4.4.5 Included in Literal
     * When a parameter entity reference appears in a literal entity
     * value, ... a single or double quote character in the replacement
     * text is always treated as a normal data character and will not
     * terminate the literal.
     * In practice it means we stop the loop only when back at parsing
     * the initial entity and the quote is found
     */
    while (((IS_CHAR(c)) && ((c != stop) || /* checked */
	    (ctxt->input != input))) && (ctxt->instate != XML_PARSER_EOF)) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
                goto error;
	    }
	    buf = tmp;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);

	GROW;
	c = CUR_CHAR(l);
	if (c == 0) {
	    GROW;
	    c = CUR_CHAR(l);
	}

        if (len > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_NOT_FINISHED,
                           "entity value too long\n");
            goto error;
        }
    }
    buf[len] = 0;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    if (c != stop) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
        goto error;
    }
    NEXT;

    /*
     * Raise problem w.r.t. '&' and '%' being used in non-entities
     * reference constructs. Note Charref will be handled in
     * xmlStringDecodeEntities()
     */
    cur = buf;
    while (*cur != 0) { /* non input consuming */
	if ((*cur == '%') || ((*cur == '&') && (cur[1] != '#'))) {
	    xmlChar *name;
	    xmlChar tmp = *cur;
            int nameOk = 0;

	    cur++;
	    name = xmlParseStringName(ctxt, &cur);
            if (name != NULL) {
                nameOk = 1;
                xmlFree(name);
            }
            if ((nameOk == 0) || (*cur != ';')) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
	    "EntityValue: '%c' forbidden except for entities references\n",
	                          tmp);
                goto error;
	    }
	    if ((tmp == '%') && (ctxt->inSubset == 1) &&
		(ctxt->inputNr == 1)) {
		xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                goto error;
	    }
	    if (*cur == 0)
	        break;
	}
	cur++;
    }

    /*
     * Then PEReference entities are substituted.
     *
     * NOTE: 4.4.7 Bypassed
     * When a general entity reference appears in the EntityValue in
     * an entity declaration, it is bypassed and left as is.
     * so XML_SUBSTITUTE_REF is not set here.
     */
    ++ctxt->depth;
    ret = xmlStringDecodeEntities(ctxt, buf, XML_SUBSTITUTE_PEREF,
                                  0, 0, 0);
    --ctxt->depth;
    if (orig != NULL) {
        *orig = buf;
        buf = NULL;
    }

error:
    if (buf != NULL)
        xmlFree(buf);
    return(ret);
}